

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O3

QByteArray * qgetenv(QByteArray *__return_storage_ptr__,char *varName)

{
  char *data;
  
  data = getenv(varName);
  QByteArray::QByteArray(__return_storage_ptr__,data,-1);
  return __return_storage_ptr__;
}

Assistant:

QByteArray qgetenv(const char *varName)
{
    const auto locker = qt_scoped_lock(environmentMutex);
    return QByteArray(::getenv(varName));
}